

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbus.c
# Opt level: O0

void nn_xbus_rm(nn_sockbase *self,nn_pipe *pipe)

{
  nn_dist *self_00;
  nn_pipe *in_RSI;
  nn_dist_data *in_RDI;
  nn_xbus_data *data;
  nn_xbus *xbus;
  
  if (in_RDI == (nn_dist_data *)0x0) {
    in_RDI = (nn_dist_data *)0x0;
  }
  self_00 = (nn_dist *)nn_pipe_getdata(in_RSI);
  nn_fq_rm((nn_fq *)self_00,(nn_fq_data *)in_RDI);
  nn_dist_rm(self_00,in_RDI);
  nn_free((void *)0x156a35);
  return;
}

Assistant:

void nn_xbus_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xbus *xbus;
    struct nn_xbus_data *data;

    xbus = nn_cont (self, struct nn_xbus, sockbase);
    data = nn_pipe_getdata (pipe);

    nn_fq_rm (&xbus->inpipes, &data->initem);
    nn_dist_rm (&xbus->outpipes, &data->outitem);

    nn_free (data);
}